

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

void __thiscall
google::protobuf::DescriptorBuilder::ValidateFieldOptions
          (DescriptorBuilder *this,FieldDescriptor *field,FieldDescriptorProto *proto)

{
  FieldDescriptor FVar1;
  FieldDescriptor FVar2;
  undefined1 *puVar3;
  long lVar4;
  string *input;
  size_t __n;
  bool bVar5;
  int iVar6;
  Descriptor *pDVar7;
  ErrorLocation location;
  char *error;
  FieldDescriptor *local_60;
  DescriptorBuilder *local_58;
  undefined1 local_50 [32];
  
  if (this->pool_->lazily_build_dependencies_ == true) {
    if (field == (FieldDescriptor *)0x0) {
      return;
    }
    pDVar7 = FieldDescriptor::message_type(field);
    if (pDVar7 == (Descriptor *)0x0) {
      return;
    }
  }
  if (*(char *)(*(long *)(field + 0x38) + 0x4d) == '\x01') {
    if (*(once_flag **)(field + 0x18) != (once_flag *)0x0) {
      local_50._0_8_ = FieldDescriptor::TypeOnceInit;
      local_60 = field;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(field + 0x18),(_func_void_FieldDescriptor_ptr **)local_50,&local_60
                );
    }
    if (field[2] != (FieldDescriptor)0xb) {
      AddError(this,(string *)(*(long *)(field + 8) + 0x20),&proto->super_Message,TYPE,
               "[lazy = true] can only be specified for submessage fields.");
    }
  }
  if (*(char *)(*(long *)(field + 0x38) + 0x4c) == '\x01') {
    if ((~(byte)field[1] & 0x60) == 0) {
      if (*(once_flag **)(field + 0x18) != (once_flag *)0x0) {
        local_50._0_8_ = FieldDescriptor::TypeOnceInit;
        local_60 = field;
        std::
        call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                  (*(once_flag **)(field + 0x18),(_func_void_FieldDescriptor_ptr **)local_50,
                   &local_60);
      }
      if ((byte)field[2] - 0xd < 0xfffffffc) goto LAB_003630e2;
    }
    AddError(this,(string *)(*(long *)(field + 8) + 0x20),&proto->super_Message,TYPE,
             "[packed = true] can only be specified for repeated primitive fields.");
  }
LAB_003630e2:
  if (((*(long *)(field + 0x20) != 0) &&
      (puVar3 = *(undefined1 **)(*(long *)(field + 0x20) + 0x20),
      puVar3 != _MessageOptions_default_instance_)) && (puVar3[0x48] == '\x01')) {
    if (((byte)field[1] & 8) == 0) {
      lVar4 = *(long *)(field + 8);
      error = "MessageSets cannot have fields, only extensions.";
      location = NAME;
    }
    else {
      if (((byte)field[1] & 0x60) == 0x20) {
        if (*(once_flag **)(field + 0x18) != (once_flag *)0x0) {
          local_50._0_8_ = FieldDescriptor::TypeOnceInit;
          local_60 = field;
          std::
          call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                    (*(once_flag **)(field + 0x18),(_func_void_FieldDescriptor_ptr **)local_50,
                     &local_60);
        }
        if (field[2] == (FieldDescriptor)0xb) goto LAB_00363174;
      }
      lVar4 = *(long *)(field + 8);
      error = "Extensions of MessageSets must be optional messages.";
      location = TYPE;
    }
    AddError(this,(string *)(lVar4 + 0x20),&proto->super_Message,location,error);
  }
LAB_00363174:
  if ((((*(long *)(field + 0x10) != 0) &&
       (puVar3 = *(undefined1 **)(*(long *)(field + 0x10) + 0x78),
       puVar3 != _FileOptions_default_instance_)) &&
      ((*(int *)(puVar3 + 0xa0) == 3 && (*(long *)(field + 0x20) != 0)))) &&
     (((lVar4 = *(long *)(*(long *)(field + 0x20) + 0x10), lVar4 == 0 ||
       (puVar3 = *(undefined1 **)(lVar4 + 0x78), puVar3 == _FileOptions_default_instance_)) ||
      (*(int *)(puVar3 + 0xa0) != 3)))) {
    AddError(this,(string *)(*(long *)(field + 8) + 0x20),&proto->super_Message,EXTENDEE,
             "Extensions to non-lite types can only be declared in non-lite files.  Note that you cannot extend a non-lite type to contain a lite type, but the reverse is allowed."
            );
  }
  if (*(once_flag **)(field + 0x18) != (once_flag *)0x0) {
    local_50._0_8_ = FieldDescriptor::TypeOnceInit;
    local_60 = field;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(field + 0x18),(_func_void_FieldDescriptor_ptr **)local_50,&local_60);
  }
  if (((field[2] == (FieldDescriptor)0xb) &&
      (*(char *)(*(long *)(*(long *)(field + 0x30) + 0x20) + 0x4b) == '\x01')) &&
     (bVar5 = ValidateMapEntry(this,field,proto), !bVar5)) {
    AddError(this,(string *)(*(long *)(field + 8) + 0x20),&proto->super_Message,TYPE,
             "map_entry should not be set explicitly. Use map<KeyType, ValueType> instead.");
  }
  local_58 = this;
  ValidateJSType(this,field,proto);
  FVar1 = field[1];
  if (((byte)FVar1 & 0xc) == 0xc) {
    input = *(string **)(field + 8);
    FVar2 = field[3];
    anon_unknown_1::ToJsonName((string *)local_50,input);
    __n = *(size_t *)((long)&input->_M_string_length + (ulong)((byte)FVar2 & 0x70) * 2);
    bVar5 = true;
    if (__n != local_50._8_8_) goto LAB_003632b1;
    if (__n != 0) {
      iVar6 = bcmp(*(void **)((long)&(input->_M_dataplus)._M_p + (ulong)((byte)FVar2 & 0x70) * 2),
                   (void *)local_50._0_8_,__n);
      bVar5 = iVar6 != 0;
      goto LAB_003632b1;
    }
  }
  bVar5 = false;
LAB_003632b1:
  if ((((byte)FVar1 & 0xc) == 0xc) && ((undefined1 *)local_50._0_8_ != local_50 + 0x10)) {
    operator_delete((void *)local_50._0_8_);
  }
  if (bVar5) {
    AddError(local_58,(string *)(*(long *)(field + 8) + 0x20),&proto->super_Message,OPTION_NAME,
             "option json_name is not allowed on extension fields.");
  }
  return;
}

Assistant:

void DescriptorBuilder::ValidateFieldOptions(
    FieldDescriptor* field, const FieldDescriptorProto& proto) {
  if (pool_->lazily_build_dependencies_ && (!field || !field->message_type())) {
    return;
  }
  // Only message type fields may be lazy.
  if (field->options().lazy()) {
    if (field->type() != FieldDescriptor::TYPE_MESSAGE) {
      AddError(field->full_name(), proto, DescriptorPool::ErrorCollector::TYPE,
               "[lazy = true] can only be specified for submessage fields.");
    }
  }

  // Only repeated primitive fields may be packed.
  if (field->options().packed() && !field->is_packable()) {
    AddError(
        field->full_name(), proto, DescriptorPool::ErrorCollector::TYPE,
        "[packed = true] can only be specified for repeated primitive fields.");
  }

  // Note:  Default instance may not yet be initialized here, so we have to
  //   avoid reading from it.
  if (field->containing_type_ != nullptr &&
      &field->containing_type()->options() !=
          &MessageOptions::default_instance() &&
      field->containing_type()->options().message_set_wire_format()) {
    if (field->is_extension()) {
      if (!field->is_optional() ||
          field->type() != FieldDescriptor::TYPE_MESSAGE) {
        AddError(field->full_name(), proto,
                 DescriptorPool::ErrorCollector::TYPE,
                 "Extensions of MessageSets must be optional messages.");
      }
    } else {
      AddError(field->full_name(), proto, DescriptorPool::ErrorCollector::NAME,
               "MessageSets cannot have fields, only extensions.");
    }
  }

  // Lite extensions can only be of Lite types.
  if (IsLite(field->file()) && field->containing_type_ != nullptr &&
      !IsLite(field->containing_type()->file())) {
    AddError(field->full_name(), proto,
             DescriptorPool::ErrorCollector::EXTENDEE,
             "Extensions to non-lite types can only be declared in non-lite "
             "files.  Note that you cannot extend a non-lite type to contain "
             "a lite type, but the reverse is allowed.");
  }

  // Validate map types.
  if (field->is_map()) {
    if (!ValidateMapEntry(field, proto)) {
      AddError(field->full_name(), proto, DescriptorPool::ErrorCollector::TYPE,
               "map_entry should not be set explicitly. Use map<KeyType, "
               "ValueType> instead.");
    }
  }

  ValidateJSType(field, proto);

  // json_name option is not allowed on extension fields. Note that the
  // json_name field in FieldDescriptorProto is always populated by protoc
  // when it sends descriptor data to plugins (calculated from field name if
  // the option is not explicitly set) so we can't rely on its presence to
  // determine whether the json_name option is set on the field. Here we
  // compare it against the default calculated json_name value and consider
  // the option set if they are different. This won't catch the case when
  // an user explicitly sets json_name to the default value, but should be
  // good enough to catch common misuses.
  if (field->is_extension() &&
      (field->has_json_name() &&
       field->json_name() != ToJsonName(field->name()))) {
    AddError(field->full_name(), proto,
             DescriptorPool::ErrorCollector::OPTION_NAME,
             "option json_name is not allowed on extension fields.");
  }

}